

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dothrow.c
# Opt level: O0

boolean walk_path(coord *src_cc,coord *dest_cc,_func_boolean_void_ptr_int_int *check_proc,void *arg)

{
  int iVar1;
  int iVar2;
  boolean local_59;
  int local_58;
  xchar xStack_54;
  boolean keep_going;
  int prev_y;
  int prev_x;
  int i;
  int err;
  int y_change;
  int x_change;
  int dy;
  int dx;
  int y;
  int x;
  void *arg_local;
  _func_boolean_void_ptr_int_int *check_proc_local;
  coord *dest_cc_local;
  coord *src_cc_local;
  
  local_59 = '\x01';
  x_change = (int)dest_cc->x - (int)src_cc->x;
  y_change = (int)dest_cc->y - (int)src_cc->y;
  dx = (int)src_cc->x;
  dy = (int)src_cc->y;
  if (x_change < 0) {
    err = -1;
    x_change = -x_change;
  }
  else {
    err = 1;
  }
  if (y_change < 0) {
    i = -1;
    y_change = -y_change;
  }
  else {
    i = 1;
  }
  prev_x = 0;
  prev_y = 0;
  iVar1 = dy;
  iVar2 = dx;
  if (x_change < y_change) {
    do {
      _xStack_54 = iVar2;
      local_58 = iVar1;
      if (y_change <= prev_y) break;
      _xStack_54 = dx;
      iVar2 = _xStack_54;
      xStack_54 = (xchar)dx;
      local_58 = dy;
      iVar1 = local_58;
      local_58._0_1_ = (xchar)dy;
      dy = i + dy;
      prev_x = x_change + prev_x;
      if (y_change <= prev_x) {
        dx = err + dx;
        prev_x = prev_x - y_change;
      }
      local_59 = (*check_proc)(arg,dx,dy);
      prev_y = prev_y + 1;
    } while (local_59 != '\0');
  }
  else {
    do {
      _xStack_54 = iVar2;
      local_58 = iVar1;
      if (x_change <= prev_y) break;
      _xStack_54 = dx;
      iVar2 = _xStack_54;
      xStack_54 = (xchar)dx;
      local_58 = dy;
      iVar1 = local_58;
      local_58._0_1_ = (xchar)dy;
      dx = err + dx;
      prev_x = y_change + prev_x;
      if (x_change <= prev_x) {
        dy = i + dy;
        prev_x = prev_x - x_change;
      }
      local_59 = (*check_proc)(arg,dx,dy);
      prev_y = prev_y + 1;
    } while (local_59 != '\0');
  }
  if (local_59 == '\0') {
    dest_cc->x = xStack_54;
    dest_cc->y = (xchar)local_58;
  }
  src_cc_local._7_1_ = local_59 != '\0';
  return src_cc_local._7_1_;
}

Assistant:

boolean walk_path(coord *src_cc, coord *dest_cc,
		  boolean (*check_proc)(void *, int, int), void *arg)
{
    int x, y, dx, dy, x_change, y_change, err, i, prev_x, prev_y;
    boolean keep_going = TRUE;

    /* Use Bresenham's Line Algorithm to walk from src to dest */
    dx = dest_cc->x - src_cc->x;
    dy = dest_cc->y - src_cc->y;
    prev_x = x = src_cc->x;
    prev_y = y = src_cc->y;

    if (dx < 0) {
	x_change = -1;
	dx = -dx;
    } else
	x_change = 1;
    if (dy < 0) {
	y_change = -1;
	dy = -dy;
    } else
	y_change = 1;

    i = err = 0;
    if (dx < dy) {
	while (i++ < dy) {
	    prev_x = x;
	    prev_y = y;
	    y += y_change;
	    err += dx;
	    if (err >= dy) {
		x += x_change;
		err -= dy;
	    }
	/* check for early exit condition */
	if (!(keep_going = (*check_proc)(arg, x, y)))
	    break;
	}
    } else {
	while (i++ < dx) {
	    prev_x = x;
	    prev_y = y;
	    x += x_change;
	    err += dy;
	    if (err >= dx) {
		y += y_change;
		err -= dx;
	    }
	/* check for early exit condition */
	if (!(keep_going = (*check_proc)(arg, x, y)))
	    break;
	}
    }

    if (keep_going)
	return TRUE;	/* successful */

    dest_cc->x = prev_x;
    dest_cc->y = prev_y;
    return FALSE;
}